

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this,ContextScopeBase *other)

{
  long in_RSI;
  vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_> *in_RDI;
  ContextScopeBase *in_stack_000001a0;
  value_type *in_stack_ffffffffffffffc8;
  
  IContextScope::IContextScope((IContextScope *)in_RDI);
  (in_RDI->super__Vector_base<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ContextScopeBase_0019e7f8;
  *(undefined1 *)
   &(in_RDI->super__Vector_base<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = 1;
  if ((*(byte *)(in_RSI + 8) & 1) != 0) {
    destroy(in_stack_000001a0);
  }
  *(undefined1 *)(in_RSI + 8) = 0;
  g_infoContexts();
  std::vector<doctest::IContextScope_*,_std::allocator<doctest::IContextScope_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase(ContextScopeBase&& other) {
        if (other.need_to_destroy) {
            other.destroy();
        }
        other.need_to_destroy = false;
        g_infoContexts.push_back(this);
    }